

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O3

void __thiscall
ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)1>_>::TestBody
          (ParticleTest_GetSetVelocity_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  FP *pFVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelper local_60;
  internal local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  Particle local_48;
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
            (&local_48,(BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *)this,
             (PositionType)0xc024000000000000,(PositionType)0x4024000000000000);
  local_48.p.x = 1.7489317533889174e-07;
  local_48.p.y = -0.00018756309402915045;
  local_48.p.z = -2.176072126121232e-13;
  local_48.invGamma = 0.9999999824100282;
  (this->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>).
  super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.super_BaseFixture.maxRelativeError
       = 1e-12;
  pFVar1 = &(this->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>).
            super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.super_BaseFixture.
            maxAbsoluteError;
  if (5623002.444493814 < *pFVar1 || *pFVar1 == 5623002.444493814) {
    local_68.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_3e1000007ffffe00;
    testing::internal::CmpHelperLE<double,double>
              (local_58,"dist(newVelocity, particle.getVelocity())","this->maxAbsoluteError",
               (double *)&local_68,
               &(this->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>).
                super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.super_BaseFixture.
                maxAbsoluteError);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x97,pcVar3);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  else {
    local_68.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &DAT_3ca7de92225a8e1c;
    testing::internal::CmpHelperLE<double,double>
              (local_58,"dist(newVelocity, particle.getVelocity()) / newVelocity.norm()",
               "this->maxRelativeError",(double *)&local_68,
               &(this->super_ParticleTest<pica::Particle<(pica::Dimension)1>_>).
                super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>.super_BaseFixture.
                maxRelativeError);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_68);
      if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
                 ,0x97,pcVar3);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_68.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_68.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
  }
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetSetVelocity)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;

    ParticleType particle = this->randomParticle();
    MomentumType newVelocity(5243.1654, -56.23e5, -65.237e-4);
    particle.setVelocity(newVelocity);
    this->maxRelativeError = 1e-12;
    MomentumType v = particle.getVelocity();
    ASSERT_NEAR_VECTOR(newVelocity, particle.getVelocity());
}